

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

void FRandom::StaticWriteRNGState(FILE *file)

{
  FArchive *this;
  int local_328;
  int i;
  undefined1 local_318 [8];
  FPNGChunkArchive arc;
  FRandom *rng;
  FILE *file_local;
  
  FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_318,file,0x644e6172);
  FArchive::operator<<((FArchive *)local_318,&rngseed);
  for (arc.Chunk._48_8_ = RNGList; arc.Chunk._48_8_ != 0;
      arc.Chunk._48_8_ = *(undefined8 *)(arc.Chunk._48_8_ + 8)) {
    if (*(int *)(arc.Chunk._48_8_ + 0x10) != 0) {
      this = FArchive::operator<<((FArchive *)local_318,(DWORD *)(arc.Chunk._48_8_ + 0x10));
      FArchive::operator<<(this,(SDWORD *)(arc.Chunk._48_8_ + 0x68));
      for (local_328 = 0; local_328 < 0x14; local_328 = local_328 + 1) {
        FArchive::operator<<
                  ((FArchive *)local_318,(DWORD *)(arc.Chunk._48_8_ + 0x18 + (long)local_328 * 4));
      }
    }
  }
  FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_318);
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FILE *file)
{
	FRandom *rng;
	FPNGChunkArchive arc (file, RAND_ID);

	arc << rngseed;

	for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
	{
		// Only write those RNGs that have names
		if (rng->NameCRC != 0)
		{
			arc << rng->NameCRC << rng->idx;
			for (int i = 0; i < SFMT::N32; ++i)
			{
				arc << rng->sfmt.u[i];
			}
		}
	}
}